

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarCommon.h
# Opt level: O0

bool __thiscall ZXing::OneD::DataBar::Pair::operator==(Pair *this,Pair *o)

{
  bool bVar1;
  Character *in_RSI;
  Character *in_RDI;
  bool local_11;
  
  local_11 = false;
  if (in_RDI[2].value == in_RSI[2].value) {
    bVar1 = Character::operator==(in_RDI,in_RSI);
    local_11 = false;
    if (bVar1) {
      local_11 = Character::operator==(in_RDI + 1,in_RSI + 1);
    }
  }
  return local_11;
}

Assistant:

bool operator==(const Pair& o) const noexcept { return finder == o.finder && left == o.left && right == o.right; }